

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnNtk.c
# Opt level: O3

void Wln_NtkFree(Wln_Ntk_t *p)

{
  void *__ptr;
  Hash_IntMan_t *__ptr_00;
  Vec_Int_t *pVVar1;
  int *piVar2;
  char *__ptr_01;
  int iVar3;
  long lVar4;
  long lVar5;
  
  iVar3 = (p->vTypes).nSize;
  if (0 < iVar3) {
    lVar4 = 8;
    lVar5 = 0;
    do {
      if ((2 < *(int *)((long)p->vFanins + lVar4 + -4)) &&
         (__ptr = *(void **)((long)&p->vFanins->nCap + lVar4), __ptr != (void *)0x0)) {
        free(__ptr);
        *(undefined8 *)((long)&p->vFanins->nCap + lVar4) = 0;
        iVar3 = (p->vTypes).nSize;
      }
      lVar5 = lVar5 + 1;
      lVar4 = lVar4 + 0x10;
    } while (lVar5 < iVar3);
  }
  if (p->vFanins != (Wln_Vec_t *)0x0) {
    free(p->vFanins);
    p->vFanins = (Wln_Vec_t *)0x0;
  }
  __ptr_00 = p->pRanges;
  if (__ptr_00 != (Hash_IntMan_t *)0x0) {
    pVVar1 = __ptr_00->vObjs;
    piVar2 = pVVar1->pArray;
    if (piVar2 != (int *)0x0) {
      free(piVar2);
    }
    free(pVVar1);
    pVVar1 = __ptr_00->vTable;
    piVar2 = pVVar1->pArray;
    if (piVar2 != (int *)0x0) {
      free(piVar2);
    }
    free(pVVar1);
    free(__ptr_00);
  }
  if (p->pManName != (Abc_Nam_t *)0x0) {
    Abc_NamStop(p->pManName);
  }
  piVar2 = (p->vCis).pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
    (p->vCis).pArray = (int *)0x0;
  }
  piVar2 = (p->vCos).pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
    (p->vCos).pArray = (int *)0x0;
  }
  piVar2 = (p->vFfs).pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
    (p->vFfs).pArray = (int *)0x0;
  }
  piVar2 = (p->vTypes).pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
    (p->vTypes).pArray = (int *)0x0;
  }
  __ptr_01 = (p->vSigns).pArray;
  if (__ptr_01 != (char *)0x0) {
    free(__ptr_01);
    (p->vSigns).pArray = (char *)0x0;
  }
  piVar2 = (p->vRanges).pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
    (p->vRanges).pArray = (int *)0x0;
  }
  piVar2 = (p->vNameIds).pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
    (p->vNameIds).pArray = (int *)0x0;
  }
  piVar2 = (p->vInstIds).pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
    (p->vInstIds).pArray = (int *)0x0;
  }
  piVar2 = (p->vTravIds).pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
    (p->vTravIds).pArray = (int *)0x0;
  }
  piVar2 = (p->vCopies).pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
    (p->vCopies).pArray = (int *)0x0;
  }
  piVar2 = (p->vBits).pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
    (p->vBits).pArray = (int *)0x0;
  }
  piVar2 = (p->vLevels).pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
    (p->vLevels).pArray = (int *)0x0;
  }
  piVar2 = (p->vRefs).pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
    (p->vRefs).pArray = (int *)0x0;
  }
  piVar2 = (p->vFanout).pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
    (p->vFanout).pArray = (int *)0x0;
  }
  piVar2 = (p->vFaninAttrs).pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
    (p->vFaninAttrs).pArray = (int *)0x0;
  }
  piVar2 = (p->vFaninLists).pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
    (p->vFaninLists).pArray = (int *)0x0;
  }
  if (p->pName != (char *)0x0) {
    free(p->pName);
    p->pName = (char *)0x0;
  }
  if (p->pSpec != (char *)0x0) {
    free(p->pSpec);
  }
  free(p);
  return;
}

Assistant:

void Wln_NtkFree( Wln_Ntk_t * p )
{
    int i;
    for ( i = 0; i < Wln_NtkObjNum(p); i++ )
        if ( Wln_ObjFaninNum(p, i) > 2 ) 
            ABC_FREE( p->vFanins[i].pArray[0] );
    ABC_FREE( p->vFanins );

    if ( p->pRanges )  Hash_IntManStop( p->pRanges );
    if ( p->pManName ) Abc_NamStop( p->pManName );

    ABC_FREE( p->vCis.pArray );
    ABC_FREE( p->vCos.pArray );
    ABC_FREE( p->vFfs.pArray );

    ABC_FREE( p->vTypes.pArray );
    ABC_FREE( p->vSigns.pArray );
    ABC_FREE( p->vRanges.pArray );
    ABC_FREE( p->vNameIds.pArray );
    ABC_FREE( p->vInstIds.pArray );
    ABC_FREE( p->vTravIds.pArray );
    ABC_FREE( p->vCopies.pArray );
    ABC_FREE( p->vBits.pArray );
    ABC_FREE( p->vLevels.pArray );
    ABC_FREE( p->vRefs.pArray );
    ABC_FREE( p->vFanout.pArray );
    ABC_FREE( p->vFaninAttrs.pArray );
    ABC_FREE( p->vFaninLists.pArray );

    ABC_FREE( p->pName );
    ABC_FREE( p->pSpec );
    ABC_FREE( p );
}